

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O2

void Res_SimSetRandomBytes(Res_Sim_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  uint *p_00;
  int i;
  ulong uVar5;
  
  for (i = 0; i < p->pAig->vPis->nSize; i = i + 1) {
    pAVar4 = Abc_NtkPi(p->pAig,i);
    p_00 = (uint *)Vec_PtrEntry(p->vPats,pAVar4->Id);
    uVar5 = (ulong)(uint)p->nWordsIn;
    if (i < p->nTruePis) {
      Abc_InfoRandomBytes(p_00,p->nWordsIn);
    }
    else {
      for (; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
        iVar1 = rand();
        iVar2 = rand();
        uVar3 = rand();
        p_00[uVar5 - 1] = uVar3 ^ iVar2 << 0xc ^ iVar1 << 0x18;
      }
    }
  }
  return;
}

Assistant:

void Res_SimSetRandomBytes( Res_Sim_t * p )
{
    Abc_Obj_t * pObj;
    unsigned * pInfo;
    int i;
    Abc_NtkForEachPi( p->pAig, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( p->vPats, pObj->Id );
        if ( i < p->nTruePis )
            Abc_InfoRandomBytes( pInfo, p->nWordsIn );
        else
            Abc_InfoRandom( pInfo, p->nWordsIn );
    }
/*
    // double-check that all are byte-patterns
    Abc_NtkForEachPi( p->pAig, pObj, i )
    {
        if ( i == p->nTruePis )
            break;
        pInfoC = (unsigned char *)Vec_PtrEntry( p->vPats, pObj->Id );
        for ( k = 0; k < p->nBytesIn; k++ )
            assert( pInfoC[k] == 0 || pInfoC[k] == 0xff );
    }
*/
}